

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring_bitmap_add_checked(roaring_bitmap_t *r,uint32_t val)

{
  uint8_t typecode;
  ushort uVar1;
  uint16_t *puVar2;
  uint8_t *puVar3;
  uint8_t uVar4;
  char cVar5;
  int iVar6;
  undefined8 in_RAX;
  shared_container_t *sc;
  run_container_t *prVar7;
  void *c;
  container_t *c_00;
  void **ppvVar8;
  long lVar9;
  uint uVar10;
  ushort key;
  int iVar11;
  long lVar12;
  run_container_t *run;
  int32_t iVar13;
  uint uVar14;
  uint8_t newtypecode;
  undefined8 uStack_38;
  
  iVar6 = (r->high_low_container).size;
  key = (ushort)(val >> 0x10);
  uStack_38 = in_RAX;
  if (((long)iVar6 == 0) || (puVar2 = (r->high_low_container).keys, puVar2[(long)iVar6 + -1] == key)
     ) {
    uVar14 = iVar6 - 1;
  }
  else {
    if (iVar6 < 1) {
      uVar14 = 0xffffffff;
      goto LAB_00113c66;
    }
    iVar11 = iVar6 + -1;
    uVar10 = 0;
    do {
      uVar14 = iVar11 + uVar10 >> 1;
      uVar1 = *(ushort *)((long)puVar2 + (ulong)(iVar11 + uVar10 & 0xfffffffe));
      if (uVar1 < key) {
        uVar10 = uVar14 + 1;
      }
      else {
        if (uVar1 <= key) goto LAB_00113acd;
        iVar11 = uVar14 - 1;
      }
    } while ((int)uVar10 <= iVar11);
    uVar14 = ~uVar10;
  }
  if ((int)uVar14 < 0) {
LAB_00113c66:
    c = calloc(1,0x10);
    c_00 = container_add(c,(uint16_t)val,'\x02',(uint8_t *)((long)&uStack_38 + 7));
    ra_insert_new_key_value_at(&r->high_low_container,~uVar14,key,c_00,uStack_38._7_1_);
    return true;
  }
LAB_00113acd:
  uVar10 = uVar14 & 0xffff;
  if (iVar6 <= (int)uVar10) {
    __assert_fail("i < ra->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x1a95,"void ra_unshare_container_at_index(roaring_array_t *, uint16_t)");
  }
  ppvVar8 = (r->high_low_container).containers;
  puVar3 = (r->high_low_container).typecodes;
  sc = (shared_container_t *)ppvVar8[uVar10];
  if (puVar3[uVar10] == '\x04') {
    sc = (shared_container_t *)shared_container_extract_copy(sc,puVar3 + uVar10);
    ppvVar8 = (r->high_low_container).containers;
  }
  *(shared_container_t **)((long)ppvVar8 + (ulong)(uVar10 * 8)) = sc;
  typecode = (r->high_low_container).typecodes[uVar10];
  run = *(run_container_t **)((long)(r->high_low_container).containers + (ulong)(uVar10 * 8));
  prVar7 = run;
  uVar4 = typecode;
  if (typecode == '\x04') {
    uVar4 = *(uint8_t *)&run->runs;
    if (uVar4 == '\x04') goto LAB_00113d36;
    prVar7 = *(run_container_t **)run;
  }
  if (uVar4 == '\x03') {
    lVar9 = cpuid_Extended_Feature_Enumeration_info(7);
    if ((*(uint *)(lVar9 + 4) & 0x20) == 0) {
      iVar13 = prVar7->n_runs;
      lVar9 = (long)iVar13;
      if (0 < lVar9) {
        lVar12 = 0;
        do {
          iVar13 = iVar13 + (uint)prVar7->runs[lVar12].length;
          lVar12 = lVar12 + 1;
        } while (lVar9 != lVar12);
      }
    }
    else {
      iVar13 = _avx2_run_container_cardinality(prVar7);
    }
  }
  else {
    if ((uVar4 != '\x02') && (uVar4 != '\x01')) goto LAB_00113d74;
    iVar13 = prVar7->n_runs;
  }
  uStack_38._0_7_ = CONCAT16(typecode,(undefined6)uStack_38);
  prVar7 = (run_container_t *)
           container_add(run,(uint16_t)val,typecode,(uint8_t *)((long)&uStack_38 + 6));
  if (prVar7 != run) {
    container_free(run,typecode);
    if ((int)uVar14 < (r->high_low_container).size) {
      (r->high_low_container).containers[uVar14] = prVar7;
      (r->high_low_container).typecodes[uVar14] = uStack_38._6_1_;
      return true;
    }
    __assert_fail("i < ra->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x1a3a,
                  "void ra_set_container_at_index(const roaring_array_t *, int32_t, container_t *, uint8_t)"
                 );
  }
  cVar5 = uStack_38._6_1_;
  if (uStack_38._6_1_ == '\x04') {
    cVar5 = *(char *)&run->runs;
    if (cVar5 == '\x04') {
LAB_00113d36:
      __assert_fail("*type != SHARED_CONTAINER_TYPE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1062,
                    "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
    }
    run = *(run_container_t **)run;
  }
  if (cVar5 == '\x03') {
    lVar9 = cpuid_Extended_Feature_Enumeration_info(7);
    if ((*(uint *)(lVar9 + 4) & 0x20) == 0) {
      iVar6 = run->n_runs;
      lVar9 = (long)iVar6;
      if (0 < lVar9) {
        lVar12 = 0;
        do {
          iVar6 = iVar6 + (uint)run->runs[lVar12].length;
          lVar12 = lVar12 + 1;
        } while (lVar9 != lVar12);
      }
    }
    else {
      iVar6 = _avx2_run_container_cardinality(run);
    }
  }
  else {
    if ((cVar5 != '\x02') && (cVar5 != '\x01')) {
LAB_00113d74:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x10fa,"int container_get_cardinality(const container_t *, uint8_t)");
    }
    iVar6 = run->n_runs;
  }
  return iVar13 != iVar6;
}

Assistant:

bool roaring_bitmap_add_checked(roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    const int i = ra_get_index(&r->high_low_container, hb);
    uint8_t typecode;
    bool result = false;
    if (i >= 0) {
        ra_unshare_container_at_index(&r->high_low_container, i);
        container_t *container =
            ra_get_container_at_index(&r->high_low_container, i, &typecode);

        const int oldCardinality =
            container_get_cardinality(container, typecode);

        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_add(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
            result = true;
        } else {
            const int newCardinality =
                container_get_cardinality(container, newtypecode);

            result = oldCardinality != newCardinality;
        }
    } else {
        array_container_t *newac = array_container_create();
        container_t *container = container_add(newac, val & 0xFFFF,
                                        ARRAY_CONTAINER_TYPE, &typecode);
        // we could just assume that it stays an array container
        ra_insert_new_key_value_at(&r->high_low_container, -i - 1, hb,
                                   container, typecode);
        result = true;
    }

    return result;
}